

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCore.c
# Opt level: O2

int If_ManPerformMappingComb(If_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  float *pfVar3;
  void *pvVar4;
  abctime aVar5;
  If_Par_t *pIVar6;
  abctime aVar7;
  ulong uVar8;
  ulong uVar9;
  int level;
  If_Man_t *pIVar10;
  int iVar11;
  float fVar12;
  
  aVar5 = Abc_Clock();
  pVVar2 = p->vCis;
  uVar1 = pVVar2->nSize;
  uVar9 = 0;
  uVar8 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pfVar3 = p->pPars->pTimesArr;
    if (pfVar3 == (float *)0x0) {
      fVar12 = 0.0;
    }
    else {
      fVar12 = pfVar3[uVar9];
    }
    pvVar4 = pVVar2->pArray[uVar9];
    *(float *)((long)pvVar4 + 0x5c) = fVar12;
    *(undefined4 *)((long)pvVar4 + 0x30) = 0x3f800000;
  }
  pIVar6 = p->pPars;
  pIVar10 = p;
  if ((pIVar6->fPreprocess == 0) || (pIVar6->fArea != 0)) {
    If_ManPerformMappingRound(p,pIVar6->nCutsMax,0,0,1,"Delay");
    pIVar6 = p->pPars;
  }
  else {
    If_ManPerformMappingRound(p,pIVar6->nCutsMax,0,1,1,"Delay");
    p->pPars->fFancy = 1;
    If_ManResetOriginalRefs(p);
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,0,1,0,"Delay-2");
    pIVar6 = p->pPars;
    pIVar6->fArea = 1;
    pIVar6->fFancy = 0;
    If_ManResetOriginalRefs(p);
    If_ManPerformMappingRound(p,p->pPars->nCutsMax,0,1,0,"Area");
    pIVar6 = p->pPars;
    pIVar6->fArea = 0;
  }
  if (pIVar6->fExpRed != 0) {
    pIVar10 = p;
    If_ManImproveMapping(p);
  }
  for (iVar11 = 0; pIVar6 = p->pPars, iVar11 < pIVar6->nFlowIters; iVar11 = iVar11 + 1) {
    pIVar10 = p;
    If_ManPerformMappingRound(p,pIVar6->nCutsMax,1,0,0,"Flow");
    if (p->pPars->fExpRed != 0) {
      pIVar10 = p;
      If_ManImproveMapping(p);
    }
  }
  for (iVar11 = 0; level = (int)pIVar10, iVar11 < pIVar6->nAreaIters; iVar11 = iVar11 + 1) {
    pIVar10 = p;
    If_ManPerformMappingRound(p,pIVar6->nCutsMax,2,0,0,"Area");
    pIVar6 = p->pPars;
    if (pIVar6->fExpRed != 0) {
      pIVar10 = p;
      If_ManImproveMapping(p);
      pIVar6 = p->pPars;
    }
  }
  if (pIVar6->fVerbose != 0) {
    aVar7 = Abc_Clock();
    Abc_Print(level,"%s =","Total time");
    Abc_Print(level,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
  }
  aVar7 = Abc_Clock();
  s_MappingTime = aVar7 - aVar5;
  pIVar6 = p->pPars;
  pIVar6->FinalDelay = p->RequiredGlo;
  pIVar6->FinalArea = p->AreaGlo;
  return 1;
}

Assistant:

int If_ManPerformMappingComb( If_Man_t * p )
{
    If_Obj_t * pObj;
    abctime clkTotal = Abc_Clock();
    int i;

    // set arrival times and fanout estimates
    If_ManForEachCi( p, pObj, i )
    {
        If_ObjSetArrTime( pObj, p->pPars->pTimesArr ? p->pPars->pTimesArr[i] : (float)0.0 );
        pObj->EstRefs = (float)1.0;
    }

    // delay oriented mapping
    if ( p->pPars->fPreprocess && !p->pPars->fArea )
    {
        // map for delay
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 1, "Delay" );
        // map for delay second option
        p->pPars->fFancy = 1;
        If_ManResetOriginalRefs( p );
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 0, "Delay-2" );
        p->pPars->fFancy = 0;
        // map for area
        p->pPars->fArea = 1;
        If_ManResetOriginalRefs( p );
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 1, 0, "Area" );
        p->pPars->fArea = 0;
    }
    else
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 0, 0, 1, "Delay" );

    // try to improve area by expanding and reducing the cuts
    if ( p->pPars->fExpRed )
        If_ManImproveMapping( p );

    // area flow oriented mapping
    for ( i = 0; i < p->pPars->nFlowIters; i++ )
    {
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 1, 0, 0, "Flow" );
        if ( p->pPars->fExpRed )
            If_ManImproveMapping( p );
    }

    // area oriented mapping
    for ( i = 0; i < p->pPars->nAreaIters; i++ )
    {
        If_ManPerformMappingRound( p, p->pPars->nCutsMax, 2, 0, 0, "Area" );
        if ( p->pPars->fExpRed )
            If_ManImproveMapping( p );
    }

    if ( p->pPars->fVerbose )
    {
//        Abc_Print( 1, "Total memory = %7.2f MB. Peak cut memory = %7.2f MB.  ", 
//            1.0 * (p->nObjBytes + 2*sizeof(void *)) * If_ManObjNum(p) / (1<<20), 
//            1.0 * p->nSetBytes * Mem_FixedReadMaxEntriesUsed(p->pMemSet) / (1<<20) );
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clkTotal );
    }
//    Abc_Print( 1, "Cross cut memory = %d.\n", Mem_FixedReadMaxEntriesUsed(p->pMemSet) );
    s_MappingTime = Abc_Clock() - clkTotal;
//    Abc_Print( 1, "Special POs = %d.\n", If_ManCountSpecialPos(p) );

/*
    {
        static char * pLastName = NULL;
        FILE * pTable = fopen( "fpga/ucsb/stats.txt", "a+" );
        if ( pLastName == NULL || strcmp(pLastName, p->pName) )
        {
            fprintf( pTable, "\n" );
            fprintf( pTable, "%s ", p->pName );

            fprintf( pTable, "%d ", If_ManCiNum(p) );
            fprintf( pTable, "%d ", If_ManCoNum(p) );
            fprintf( pTable, "%d ", If_ManAndNum(p) );

            ABC_FREE( pLastName );
            pLastName = Abc_UtilStrsav( p->pName );
        }

        fprintf( pTable, "%d ", (int)p->AreaGlo );
        fprintf( pTable, "%d ", (int)p->RequiredGlo );
        fclose( pTable );
    }
*/
    p->pPars->FinalDelay = p->RequiredGlo;
    p->pPars->FinalArea  = p->AreaGlo;
    return 1;
}